

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  cJSON *item_00;
  cJSON *item_local;
  cJSON *array_local;
  
  if (array == (cJSON *)0x0) {
    array_local._4_4_ = 0;
  }
  else {
    item_00 = create_reference(item,&global_hooks);
    array_local._4_4_ = add_item_to_array(array,item_00);
  }
  return array_local._4_4_;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)
{
    if (array == NULL)
    {
        return false;
    }

    return add_item_to_array(array, create_reference(item, &global_hooks));
}